

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
CustomLayerParams_CustomLayerParamValue
          (CustomLayerParams_CustomLayerParamValue *this,
          CustomLayerParams_CustomLayerParamValue *from)

{
  bool bVar1;
  ValueCase VVar2;
  int32_t value;
  string *psVar3;
  string *value_00;
  Arena *pAVar4;
  int64_t value_01;
  double value_02;
  CustomLayerParams_CustomLayerParamValue *from_local;
  CustomLayerParams_CustomLayerParamValue *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CustomLayerParams_CustomLayerParamValue_006f5288;
  ValueUnion::ValueUnion((ValueUnion *)&(this->value_).stringvalue_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  clear_has_value(this);
  VVar2 = value_case(from);
  switch(VVar2) {
  case VALUE_NOT_SET:
    break;
  case kDoubleValue:
    value_02 = _internal_doublevalue(from);
    _internal_set_doublevalue(this,value_02);
    break;
  case kStringValue:
    psVar3 = _internal_stringvalue_abi_cxx11_(from);
    bVar1 = _internal_has_stringvalue(this);
    if (!bVar1) {
      clear_value(this);
      set_has_stringvalue(this);
      value_00 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
                (&(this->value_).stringvalue_,value_00);
    }
    pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&this->value_,psVar3,pAVar4);
    break;
  case kIntValue:
    value = _internal_intvalue(from);
    _internal_set_intvalue(this,value);
    break;
  case kLongValue:
    value_01 = _internal_longvalue(from);
    _internal_set_longvalue(this,value_01);
    break;
  case kBoolValue:
    bVar1 = _internal_boolvalue(from);
    _internal_set_boolvalue(this,bVar1);
  }
  return;
}

Assistant:

CustomLayerParams_CustomLayerParamValue::CustomLayerParams_CustomLayerParamValue(const CustomLayerParams_CustomLayerParamValue& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_value();
  switch (from.value_case()) {
    case kDoubleValue: {
      _internal_set_doublevalue(from._internal_doublevalue());
      break;
    }
    case kStringValue: {
      _internal_set_stringvalue(from._internal_stringvalue());
      break;
    }
    case kIntValue: {
      _internal_set_intvalue(from._internal_intvalue());
      break;
    }
    case kLongValue: {
      _internal_set_longvalue(from._internal_longvalue());
      break;
    }
    case kBoolValue: {
      _internal_set_boolvalue(from._internal_boolvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
}